

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

Node * __thiscall Parser::function(Node *__return_storage_ptr__,Parser *this)

{
  bool bVar1;
  lexemtype lVar2;
  ostream *poVar3;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar4;
  Node local_120;
  undefined1 local_d9;
  _Base_ptr local_d8;
  undefined1 local_d0;
  string local_c8 [32];
  undefined1 local_a8 [64];
  undefined1 local_68 [56];
  string funcName;
  Parser *this_local;
  Node *funcNode;
  
  std::__cxx11::string::string((string *)(local_68 + 0x30));
  bVar1 = isDataType(this);
  if (!bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Unexpected unqualified-id \"");
    getLexemValue_abi_cxx11_((Parser *)local_68);
    poVar3 = std::operator<<(poVar3,(string *)local_68);
    poVar3 = std::operator<<(poVar3,"\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_68);
    exit(0);
  }
  nextLexem(this);
  lVar2 = getLexemType(this);
  if (lVar2 != IDENTIFIER) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Unexpected unqualified-id \"");
    getLexemValue_abi_cxx11_((Parser *)(local_a8 + 0x20));
    poVar3 = std::operator<<(poVar3,(string *)(local_a8 + 0x20));
    poVar3 = std::operator<<(poVar3,"\"");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)(local_a8 + 0x20));
    exit(0);
  }
  getLexemValue_abi_cxx11_((Parser *)local_a8);
  std::__cxx11::string::operator=((string *)(local_68 + 0x30),(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::string(local_c8,(string *)(local_68 + 0x30));
  bVar1 = doesFunctionExist(this,(string *)local_c8);
  std::__cxx11::string::~string(local_c8);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Function with that name already exists");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  pVar4 = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::insert(&this->FUNCTIONS,(value_type *)(local_68 + 0x30));
  local_d8 = (_Base_ptr)pVar4.first._M_node;
  local_d0 = pVar4.second;
  nextLexem(this);
  lVar2 = getLexemType(this);
  if (lVar2 == OPAR) {
    nextLexem(this);
    lVar2 = getLexemType(this);
    if (lVar2 != CPAR) {
      poVar3 = std::operator<<((ostream *)&std::cout,"\")\" expected");
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      exit(0);
    }
    nextLexem(this);
    local_d9 = 0;
    Node::Node(__return_storage_ptr__,FUNC,(string *)(local_68 + 0x30));
    statement(&local_120,this);
    Node::addSubnode(__return_storage_ptr__,&local_120);
    Node::~Node(&local_120);
    if ((this->didFuncReturn & 1U) != 0) {
      this->didFuncReturn = false;
      nextLexem(this);
      local_d9 = 1;
      std::__cxx11::string::~string((string *)(local_68 + 0x30));
      return __return_storage_ptr__;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,"Function \"");
    poVar3 = std::operator<<(poVar3,(string *)(local_68 + 0x30));
    poVar3 = std::operator<<(poVar3,"\" must return statement!");
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    exit(0);
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\"(\" expected");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  exit(0);
}

Assistant:

Node Parser::function() {
    std::string funcName;
    if (!isDataType()) {
        cout << "Unexpected unqualified-id \"" << getLexemValue() << "\"" << endl;
        exit(0);
    }
    nextLexem();
    if (getLexemType() != IDENTIFIER) {
        cout << "Unexpected unqualified-id \"" << getLexemValue() << "\"" << endl;
        exit(0);
    }
    funcName = getLexemValue();
    if (doesFunctionExist(funcName)) {
        cout << "Function with that name already exists" << endl;
        exit(0);
    }
    FUNCTIONS.insert(funcName);
//    for (auto i : FUNCTIONS) {
//        cout << i << endl;
//    }
//    FUNCTIONS[funcName] = 1;
    nextLexem();
    if (getLexemType() != OPAR) {
        cout << "\"(\" expected" << endl;
        exit(0);
    }
    nextLexem();
    if (getLexemType() != CPAR) {
        cout << "\")\" expected" << endl;
        exit(0);
    }
    nextLexem();
    Node funcNode = Node(FUNC, funcName);
    funcNode.addSubnode(statement());
    if (!didFuncReturn) {
        cout << "Function \"" << funcName << "\" must return statement!" << endl;
        exit(0);
    }
    didFuncReturn = false;
    nextLexem();
    return funcNode;
}